

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::ContainerPrinter::
     PrintValue<std::vector<double,std::allocator<double>>,void>
               (vector<double,_std::allocator<double>_> *container,ostream *os)

{
  bool bVar1;
  reference value;
  double *elem;
  const_iterator __end0;
  const_iterator __begin0;
  vector<double,_std::allocator<double>_> *__range3;
  size_t count;
  size_t kMaxCount;
  ostream *os_local;
  vector<double,_std::allocator<double>_> *container_local;
  
  std::operator<<(os,'{');
  __range3 = (vector<double,_std::allocator<double>_> *)0x0;
  __end0 = std::vector<double,_std::allocator<double>_>::begin(container);
  elem = (double *)std::vector<double,_std::allocator<double>_>::end(container);
  do {
    bVar1 = __gnu_cxx::operator==<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                      (&__end0,(__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                                *)&elem);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
LAB_002b47c7:
      if (__range3 != (vector<double,_std::allocator<double>_> *)0x0) {
        std::operator<<(os,' ');
      }
      std::operator<<(os,'}');
      return;
    }
    value = __gnu_cxx::
            __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
            operator*(&__end0);
    if ((__range3 != (vector<double,_std::allocator<double>_> *)0x0) &&
       (std::operator<<(os,','), __range3 == (vector<double,_std::allocator<double>_> *)0x20)) {
      std::operator<<(os," ...");
      goto LAB_002b47c7;
    }
    std::operator<<(os,' ');
    UniversalPrint<double>(value,os);
    __range3 = (vector<double,_std::allocator<double>_> *)
               ((long)&(__range3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start + 1);
    __gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&__end0);
  } while( true );
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }